

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void write_vector_vector<QPDF::HPageOffsetEntry>
               (BitWriter *w,int nitems1,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1,
               offset_in_HPageOffsetEntry_to_int nitems2,int bits,
               offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2)

{
  BitWriter *this;
  size_t sVar1;
  reference pvVar2;
  reference i;
  unsigned_long_long val;
  ulong local_48;
  size_t i2;
  size_t i1;
  offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2_local;
  offset_in_HPageOffsetEntry_to_int oStack_28;
  int bits_local;
  offset_in_HPageOffsetEntry_to_int nitems2_local;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1_local;
  BitWriter *pBStack_10;
  int nitems1_local;
  BitWriter *w_local;
  
  i2 = 0;
  vec2_local._4_4_ = bits;
  oStack_28 = nitems2;
  nitems2_local = (offset_in_HPageOffsetEntry_to_int)vec1;
  vec1_local._4_4_ = nitems1;
  pBStack_10 = w;
  while( true ) {
    sVar1 = QIntC::to_size<int>((int *)((long)&vec1_local + 4));
    if (sVar1 <= i2) break;
    local_48 = 0;
    while( true ) {
      pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *
                          )nitems2_local,i2);
      sVar1 = QIntC::to_size<int>((int *)((long)&pvVar2->delta_nobjects + oStack_28));
      this = pBStack_10;
      if (sVar1 <= local_48) break;
      pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *
                          )nitems2_local,i2);
      i = std::vector<int,_std::allocator<int>_>::at
                    ((vector<int,_std::allocator<int>_> *)((long)&pvVar2->delta_nobjects + vec2),
                     local_48);
      val = QIntC::to_ulonglong<int>(i);
      sVar1 = QIntC::to_size<int>((int *)((long)&vec2_local + 4));
      BitWriter::writeBits(this,val,sVar1);
      local_48 = local_48 + 1;
    }
    i2 = i2 + 1;
  }
  BitWriter::flush(pBStack_10);
  return;
}

Assistant:

static void
write_vector_vector(
    BitWriter& w,
    int nitems1,
    std::vector<T>& vec1,
    int T::* nitems2,
    int bits,
    std::vector<int> T::* vec2)
{
    // nitems1 times, write nitems2 (from the ith element of vec1) items from the vec2 vector field
    // of the ith item of vec1.
    for (size_t i1 = 0; i1 < QIntC::to_size(nitems1); ++i1) {
        for (size_t i2 = 0; i2 < QIntC::to_size(vec1.at(i1).*nitems2); ++i2) {
            w.writeBits(QIntC::to_ulonglong((vec1.at(i1).*vec2).at(i2)), QIntC::to_size(bits));
        }
    }
    w.flush();
}